

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<kj::CappedArray<char,3ul>,char,kj::CappedArray<char,5ul>,char,kj::CappedArray<char,9ul>,char,kj::CappedArray<char,17ul>>
          (String *__return_storage_ptr__,kj *this,CappedArray<char,_3UL> *params,char *params_1,
          CappedArray<char,_5UL> *params_2,char *params_3,CappedArray<char,_9UL> *params_4,
          char *params_5,CappedArray<char,_17UL> *params_6)

{
  CappedArray<char,_3UL> *value;
  char *pcVar1;
  CappedArray<char,_5UL> *value_00;
  CappedArray<char,_9UL> *value_01;
  CappedArray<char,_17UL> *value_02;
  ArrayPtr<const_char> *in_stack_ffffffffffffff58;
  ArrayPtr<const_char> local_90;
  char local_79 [1];
  ArrayPtr<const_char> local_78;
  char local_61 [1];
  ArrayPtr<const_char> local_60;
  char local_49 [1];
  ArrayPtr<const_char> local_48;
  NoInfer<kj::CappedArray<char,_9UL>_> *local_38;
  CappedArray<char,_9UL> *params_local_4;
  char *params_local_3;
  CappedArray<char,_5UL> *params_local_2;
  char *params_local_1;
  CappedArray<char,_3UL> *params_local;
  
  local_38 = (NoInfer<kj::CappedArray<char,_9UL>_> *)params_3;
  params_local_4 = (CappedArray<char,_9UL> *)params_2;
  params_local_3 = params_1;
  params_local_2 = (CappedArray<char,_5UL> *)params;
  params_local_1 = (char *)this;
  params_local = (CappedArray<char,_3UL> *)__return_storage_ptr__;
  value = fwd<kj::CappedArray<char,3ul>>((NoInfer<kj::CappedArray<char,_3UL>_> *)this);
  local_48 = toCharSequence<kj::CappedArray<char,3ul>>(value);
  pcVar1 = fwd<char>((NoInfer<char> *)params_local_2);
  local_49[0] = (char)toCharSequence<char>(pcVar1);
  value_00 = fwd<kj::CappedArray<char,5ul>>((NoInfer<kj::CappedArray<char,_5UL>_> *)params_local_3);
  local_60 = toCharSequence<kj::CappedArray<char,5ul>>(value_00);
  pcVar1 = fwd<char>((NoInfer<char> *)params_local_4);
  local_61[0] = (char)toCharSequence<char>(pcVar1);
  value_01 = fwd<kj::CappedArray<char,9ul>>(local_38);
  local_78 = toCharSequence<kj::CappedArray<char,9ul>>(value_01);
  pcVar1 = fwd<char>((NoInfer<char> *)params_4);
  local_79[0] = (char)toCharSequence<char>(pcVar1);
  value_02 = fwd<kj::CappedArray<char,17ul>>((NoInfer<kj::CappedArray<char,_17UL>_> *)params_5);
  local_90 = toCharSequence<kj::CappedArray<char,17ul>>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_48,(ArrayPtr<const_char> *)local_49,
             (FixedArray<char,_1UL> *)&local_60,(ArrayPtr<const_char> *)local_61,
             (FixedArray<char,_1UL> *)&local_78,(ArrayPtr<const_char> *)local_79,
             (FixedArray<char,_1UL> *)&local_90,in_stack_ffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}